

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

int __thiscall Liby::Buffer::copy(Buffer *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  off_t oVar1;
  off_t in_RAX;
  
  if (this != (Buffer *)dst) {
    if (this->buffer_ != (char *)0x0) {
      operator_delete__(this->buffer_);
      this->buffer_ = (char *)0x0;
    }
    this->buffer_ = *(char **)dst;
    *(undefined8 *)dst = 0;
    oVar1 = *(off_t *)(dst + 0x10);
    this->leftIndex_ = *(off_t *)(dst + 8);
    this->rightIndex_ = oVar1;
    in_RAX = *(off_t *)(dst + 0x18);
    this->capacity_ = in_RAX;
  }
  return (int)in_RAX;
}

Assistant:

void Buffer::copy(Buffer &that) {
    if (this == &that)
        return;
    resetBuffer();
    buffer_ = that.buffer_;
    that.buffer_ = nullptr;
    leftIndex_ = that.leftIndex_;
    rightIndex_ = that.rightIndex_;
    capacity_ = that.capacity_;
}